

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

bool __thiscall QObject::isSignalConnected(QObject *this,QMetaMethod *signal)

{
  QObjectPrivate *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (signal->mobj == (QMetaObject *)0x0) {
    bVar1 = false;
  }
  else {
    this_00 = (QObjectPrivate *)(this->d_ptr).d;
    iVar2 = QMetaMethod::relativeMethodIndex(signal);
    if (((signal->data).d[4] & 0x20) != 0) {
      iVar2 = QMetaObjectPrivate::originalClone(signal->mobj,iVar2);
    }
    iVar3 = QMetaObjectPrivate::signalOffset(signal->mobj);
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QMutexLocker<QBasicMutex>::QMutexLocker
              ((QMutexLocker<QBasicMutex> *)local_38,
               (QBasicMutex *)
               ((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p +
               ((ulong)this & 0xffffffff) % 0x418));
    bVar1 = QObjectPrivate::isSignalConnected(this_00,iVar2 + iVar3,true);
    QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QObject::isSignalConnected(const QMetaMethod &signal) const
{
    Q_D(const QObject);
    if (!signal.mobj)
        return false;

    Q_ASSERT_X(signal.mobj->cast(this) && signal.methodType() == QMetaMethod::Signal,
               "QObject::isSignalConnected" , "the parameter must be a signal member of the object");
    uint signalIndex = signal.relativeMethodIndex();

    if (signal.data.flags() & MethodCloned)
        signalIndex = QMetaObjectPrivate::originalClone(signal.mobj, signalIndex);

    signalIndex += QMetaObjectPrivate::signalOffset(signal.mobj);

    QMutexLocker locker(signalSlotLock(this));
    return d->isSignalConnected(signalIndex, true);
}